

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode Curl_ossl_verifyhost(Curl_easy *data,connectdata *conn,ssl_peer *peer,X509 *server_cert)

{
  ssl_peer *psVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  GENERAL_NAMES *a;
  int *piVar8;
  char *__s;
  size_t sVar9;
  X509_NAME *name;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  uchar *__s_00;
  void *__src;
  byte bVar10;
  undefined7 uVar11;
  CURLcode CVar12;
  char *pcVar13;
  size_t matchlen;
  int iVar14;
  uchar *peer_CN;
  in6_addr addr;
  uint local_7c;
  uchar *local_78;
  undefined4 local_70;
  undefined4 local_6c;
  ssl_peer *local_68;
  char *local_60;
  ulong local_58;
  char *local_50;
  X509 *local_48;
  undefined1 local_40 [16];
  
  pcVar13 = peer->hostname;
  local_50 = (char *)strlen(pcVar13);
  local_68 = peer;
  if ((peer->field_0x18 & 1) == 0) {
    iVar5 = 2;
    local_58 = 0;
  }
  else {
    if (((conn->bits).field_0x1 & 8) != 0) {
      iVar5 = inet_pton(10,pcVar13,local_40);
      if (iVar5 != 0) {
        iVar5 = 7;
        local_58 = 0x10;
        goto LAB_005e569b;
      }
      pcVar13 = peer->hostname;
    }
    iVar5 = inet_pton(2,pcVar13,local_40);
    local_58 = (ulong)((uint)(iVar5 != 0) * 4);
    iVar5 = (uint)(iVar5 != 0) * 5 + 2;
  }
LAB_005e569b:
  pcVar13 = (char *)0x0;
  a = (GENERAL_NAMES *)X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if (a != (GENERAL_NAMES *)0x0) {
    iVar3 = OPENSSL_sk_num(a);
    if (iVar3 < 1) {
      GENERAL_NAMES_free(a);
    }
    else {
      iVar14 = 1;
      local_6c = 0;
      local_70 = 0;
      local_7c = 0;
      local_48 = (X509 *)server_cert;
      do {
        piVar8 = (int *)OPENSSL_sk_value(a,iVar14 + -1);
        iVar4 = *piVar8;
        uVar11 = (undefined7)((ulong)pcVar13 >> 8);
        if (iVar4 == 2) {
          pcVar13 = (char *)CONCAT71(uVar11,1);
          local_6c = SUB84(pcVar13,0);
        }
        else if (iVar4 == 7) {
          pcVar13 = (char *)CONCAT71(uVar11,1);
          local_70 = SUB84(pcVar13,0);
        }
        if (iVar4 == iVar5) {
          __s = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar8 + 2));
          iVar4 = ASN1_STRING_length(*(ASN1_STRING **)(piVar8 + 2));
          matchlen = (size_t)iVar4;
          if (iVar5 == 7) {
            if (local_58 == matchlen) {
              local_60 = (char *)CONCAT71(local_60._1_7_,data == (Curl_easy *)0x0);
              iVar4 = bcmp(__s,local_40,local_58);
              bVar10 = iVar4 != 0 | (byte)local_60;
              pcVar13 = (char *)CONCAT71((int7)((ulong)pcVar13 >> 8),bVar10);
              if (bVar10 == 0) {
                local_7c = (uint)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
                if (((data->set).field_0x8bd & 0x10) != 0) {
                  _Var2 = false;
                  Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s IP address!",
                             local_68->dispname);
                  goto LAB_005e57ff;
                }
              }
              else {
                local_7c = CONCAT31((int3)(local_7c >> 8),(byte)local_7c | iVar4 == 0);
                pcVar13 = (char *)(ulong)local_7c;
              }
            }
            goto LAB_005e57fc;
          }
          if ((iVar5 != 2) || (sVar9 = strlen(__s), sVar9 != matchlen)) goto LAB_005e57fc;
          local_60 = local_68->dispname;
          pcVar13 = local_50;
          _Var2 = Curl_cert_hostcheck(__s,matchlen,local_68->hostname,(size_t)local_50);
          if (((data != (Curl_easy *)0x0) && (_Var2)) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s \"%s\"",local_60,__s);
            pcVar13 = __s;
          }
        }
        else {
LAB_005e57fc:
          _Var2 = false;
        }
LAB_005e57ff:
      } while ((iVar14 < iVar3) && (iVar14 = iVar14 + 1, _Var2 == false));
      GENERAL_NAMES_free(a);
      psVar1 = local_68;
      if (_Var2 != false || (char)local_7c != '\0') {
        return CURLE_OK;
      }
      server_cert = (X509 *)local_48;
      if ((((byte)local_6c | (byte)local_70) & 1) != 0) {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data," subjectAltName does not match %s",local_68->dispname);
        }
        Curl_failf(data,
                   "SSL: no alternative certificate subject name matches target host name \'%s\'",
                   psVar1->dispname);
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
  }
  local_78 = (uchar *)0x0;
  name = X509_get_subject_name((X509 *)server_cert);
  if (name == (X509_NAME *)0x0) {
LAB_005e59f5:
    pcVar13 = "SSL: unable to obtain common name from peer certificate";
LAB_005e59fc:
    Curl_failf(data,pcVar13);
  }
  else {
    iVar5 = -1;
    do {
      iVar3 = iVar5;
      iVar5 = X509_NAME_get_index_by_NID(name,0xd,iVar3);
    } while (-1 < iVar5);
    if (iVar3 < 0) goto LAB_005e59f5;
    ne = X509_NAME_get_entry(name,iVar3);
    x = X509_NAME_ENTRY_get_data(ne);
    if (x == (ASN1_STRING *)0x0) goto LAB_005e59f5;
    iVar5 = ASN1_STRING_type(x);
    if (iVar5 != 0xc) {
      uVar6 = ASN1_STRING_to_UTF8(&local_78,x);
      __s_00 = local_78;
      if (local_78 != (uchar *)0x0) goto LAB_005e598e;
      goto LAB_005e59f5;
    }
    uVar6 = ASN1_STRING_length(x);
    if ((int)uVar6 < 0) goto LAB_005e59f5;
    __s_00 = (uchar *)CRYPTO_malloc(uVar6 + 1,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                    ,0x8f1);
    if (__s_00 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    local_78 = __s_00;
    __src = (void *)ASN1_STRING_get0_data(x);
    memcpy(__s_00,__src,(ulong)uVar6);
    __s_00[uVar6] = '\0';
LAB_005e598e:
    sVar9 = strlen((char *)__s_00);
    uVar7 = curlx_uztosi(sVar9);
    psVar1 = local_68;
    if (uVar7 != uVar6) {
      pcVar13 = "SSL: illegal cert name field";
      goto LAB_005e59fc;
    }
    if (local_78 == (uchar *)0x0) goto LAB_005e59f5;
    _Var2 = Curl_cert_hostcheck((char *)local_78,(long)(int)uVar6,local_68->hostname,
                                (size_t)local_50);
    if (_Var2) {
      CVar12 = CURLE_OK;
      if ((data != (Curl_easy *)0x0) && (CVar12 = CURLE_OK, ((data->set).field_0x8bd & 0x10) != 0))
      {
        CVar12 = CURLE_OK;
        Curl_infof(data," common name: %s (matched)",local_78);
      }
      goto LAB_005e5a0c;
    }
    Curl_failf(data,"SSL: certificate subject name \'%s\' does not match target host name \'%s\'",
               local_78,psVar1->dispname);
  }
  CVar12 = CURLE_PEER_FAILED_VERIFICATION;
LAB_005e5a0c:
  if (local_78 != (uchar *)0x0) {
    CRYPTO_free(local_78);
  }
  return CVar12;
}

Assistant:

CURLcode Curl_ossl_verifyhost(struct Curl_easy *data, struct connectdata *conn,
                              struct ssl_peer *peer, X509 *server_cert)
{
  bool matched = FALSE;
  int target = GEN_DNS; /* target type, GEN_DNS or GEN_IPADD */
  size_t addrlen = 0;
  STACK_OF(GENERAL_NAME) *altnames;
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
  CURLcode result = CURLE_OK;
  bool dNSName = FALSE; /* if a dNSName field exists in the cert */
  bool iPAddress = FALSE; /* if a iPAddress field exists in the cert */
  size_t hostlen;

  (void)conn;
  hostlen = strlen(peer->hostname);
  if(peer->is_ip_address) {
#ifdef ENABLE_IPV6
    if(conn->bits.ipv6_ip &&
       Curl_inet_pton(AF_INET6, peer->hostname, &addr)) {
      target = GEN_IPADD;
      addrlen = sizeof(struct in6_addr);
    }
    else
#endif
      if(Curl_inet_pton(AF_INET, peer->hostname, &addr)) {
        target = GEN_IPADD;
        addrlen = sizeof(struct in_addr);
      }
  }

  /* get a "list" of alternative names */
  altnames = X509_get_ext_d2i(server_cert, NID_subject_alt_name, NULL, NULL);

  if(altnames) {
#if defined(OPENSSL_IS_BORINGSSL) || defined(OPENSSL_IS_AWSLC)
    size_t numalts;
    size_t i;
#else
    int numalts;
    int i;
#endif
    bool dnsmatched = FALSE;
    bool ipmatched = FALSE;

    /* get amount of alternatives, RFC2459 claims there MUST be at least
       one, but we don't depend on it... */
    numalts = sk_GENERAL_NAME_num(altnames);

    /* loop through all alternatives - until a dnsmatch */
    for(i = 0; (i < numalts) && !dnsmatched; i++) {
      /* get a handle to alternative name number i */
      const GENERAL_NAME *check = sk_GENERAL_NAME_value(altnames, i);

      if(check->type == GEN_DNS)
        dNSName = TRUE;
      else if(check->type == GEN_IPADD)
        iPAddress = TRUE;

      /* only check alternatives of the same type the target is */
      if(check->type == target) {
        /* get data and length */
        const char *altptr = (char *)ASN1_STRING_get0_data(check->d.ia5);
        size_t altlen = (size_t) ASN1_STRING_length(check->d.ia5);

        switch(target) {
        case GEN_DNS: /* name/pattern comparison */
          /* The OpenSSL man page explicitly says: "In general it cannot be
             assumed that the data returned by ASN1_STRING_data() is null
             terminated or does not contain embedded nulls." But also that
             "The actual format of the data will depend on the actual string
             type itself: for example for an IA5String the data will be ASCII"

             It has been however verified that in 0.9.6 and 0.9.7, IA5String
             is always null-terminated.
          */
          if((altlen == strlen(altptr)) &&
             /* if this isn't true, there was an embedded zero in the name
                string and we cannot match it. */
             subj_alt_hostcheck(data, altptr, altlen,
                                peer->hostname, hostlen,
                                peer->dispname)) {
            dnsmatched = TRUE;
          }
          break;

        case GEN_IPADD: /* IP address comparison */
          /* compare alternative IP address if the data chunk is the same size
             our server IP address is */
          if((altlen == addrlen) && !memcmp(altptr, &addr, altlen)) {
            ipmatched = TRUE;
            infof(data,
                  " subjectAltName: host \"%s\" matched cert's IP address!",
                  peer->dispname);
          }
          break;
        }
      }
    }
    GENERAL_NAMES_free(altnames);

    if(dnsmatched || ipmatched)
      matched = TRUE;
  }

  if(matched)
    /* an alternative name matched */
    ;
  else if(dNSName || iPAddress) {
    infof(data, " subjectAltName does not match %s", peer->dispname);
    failf(data, "SSL: no alternative certificate subject name matches "
          "target host name '%s'", peer->dispname);
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    /* we have to look to the last occurrence of a commonName in the
       distinguished one to get the most significant one. */
    int i = -1;
    unsigned char *peer_CN = NULL;
    int peerlen = 0;

    /* The following is done because of a bug in 0.9.6b */
    X509_NAME *name = X509_get_subject_name(server_cert);
    if(name) {
      int j;
      while((j = X509_NAME_get_index_by_NID(name, NID_commonName, i)) >= 0)
        i = j;
    }

    /* we have the name entry and we will now convert this to a string
       that we can use for comparison. Doing this we support BMPstring,
       UTF8, etc. */

    if(i >= 0) {
      ASN1_STRING *tmp =
        X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));

      /* In OpenSSL 0.9.7d and earlier, ASN1_STRING_to_UTF8 fails if the input
         is already UTF-8 encoded. We check for this case and copy the raw
         string manually to avoid the problem. This code can be made
         conditional in the future when OpenSSL has been fixed. */
      if(tmp) {
        if(ASN1_STRING_type(tmp) == V_ASN1_UTF8STRING) {
          peerlen = ASN1_STRING_length(tmp);
          if(peerlen >= 0) {
            peer_CN = OPENSSL_malloc(peerlen + 1);
            if(peer_CN) {
              memcpy(peer_CN, ASN1_STRING_get0_data(tmp), peerlen);
              peer_CN[peerlen] = '\0';
            }
            else
              result = CURLE_OUT_OF_MEMORY;
          }
        }
        else /* not a UTF8 name */
          peerlen = ASN1_STRING_to_UTF8(&peer_CN, tmp);

        if(peer_CN && (curlx_uztosi(strlen((char *)peer_CN)) != peerlen)) {
          /* there was a terminating zero before the end of string, this
             cannot match and we return failure! */
          failf(data, "SSL: illegal cert name field");
          result = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
    }

    if(result)
      /* error already detected, pass through */
      ;
    else if(!peer_CN) {
      failf(data,
            "SSL: unable to obtain common name from peer certificate");
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else if(!Curl_cert_hostcheck((const char *)peer_CN,
                                 peerlen, peer->hostname, hostlen)) {
      failf(data, "SSL: certificate subject name '%s' does not match "
            "target host name '%s'", peer_CN, peer->dispname);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
      infof(data, " common name: %s (matched)", peer_CN);
    }
    if(peer_CN)
      OPENSSL_free(peer_CN);
  }

  return result;
}